

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROMHeader.cpp
# Opt level: O0

colorTransmissionSystem __thiscall SNESROMHeader::getColorTransmissionSystem(SNESROMHeader *this)

{
  SNESROMHeader *this_local;
  
  if (this->m_HeaderData[0x19] < 2) {
    this_local._4_4_ = NTSC;
  }
  else if (this->m_HeaderData[0x19] < 0xd) {
    this_local._4_4_ = PAL;
  }
  else {
    this_local._4_4_ = NTSC;
  }
  return this_local._4_4_;
}

Assistant:

colorTransmissionSystem SNESROMHeader::getColorTransmissionSystem() const {
    if(m_HeaderData[m_CountryCodeIndex] <= 0x01) {
        return NTSC;
    } else if(m_HeaderData[m_CountryCodeIndex] <= 0x0C) {
        return PAL;
    } else {
        return NTSC;
    }
}